

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O3

void C_DrawConsole(bool hw2d)

{
  AActor *pAVar1;
  FBrokenLines **ppFVar2;
  bool bVar3;
  bool bVar4;
  FFont *pFVar5;
  DFrameBuffer *pDVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  BYTE *pBVar12;
  char *pcVar13;
  size_t sVar14;
  long lVar15;
  player_t *ppVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  FBrokenLines **ppFVar21;
  FTexture *img;
  BYTE character;
  ulong uVar22;
  undefined8 uVar23;
  int iVar24;
  double dVar25;
  char tickstr [256];
  
  iVar17 = con_scale.Value;
  if (con_scale.Value == 0) {
    iVar17 = uiscale.Value;
  }
  if (iVar17 == 0) {
    iVar17 = CleanXfac;
  }
  iVar7 = ConFont->FontHeight;
  iVar11 = (ConBottom / iVar17 + iVar7 * -2) / iVar7;
  if (ConBottom / iVar17 - (iVar7 * 7) / 2 < (iVar11 + -1) * iVar7) {
    iVar7 = iVar7 / 2;
    iVar11 = iVar11 + -1;
  }
  if ((ConBottom < C_DrawConsole::oldbottom) &&
     ((((gamestate == GS_TITLELEVEL || (gamestate == GS_LEVEL)) &&
       (viewwindowy != 0 || viewwindowx != 0)) && (viewactive)))) {
    V_SetBorderNeedRefresh();
  }
  iVar8 = NotifyTop;
  bVar3 = con_centernotify.Value;
  iVar20 = ConBottom;
  C_DrawConsole::oldbottom = ConBottom;
  if (ConsoleState == c_up) {
    if (1 < (uint)(gamestate + GS_FORCEWIPEBURN)) {
      iVar17 = SmallFont->FontHeight;
      if (con_scaletext.Value == 1) {
        iVar7 = 1;
        if (uiscale.Value == 0) {
          iVar7 = CleanYfac;
        }
        iVar17 = iVar17 * iVar7;
      }
      BorderTopRefresh =
           (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x20])();
      bVar4 = true;
      lVar15 = 0;
      do {
        pDVar6 = screen;
        pFVar5 = SmallFont;
        iVar7 = *(int *)((long)&NotifyStrings[0].TimeOut + lVar15);
        if (iVar7 != 0) {
          uVar10 = iVar7 - gametic;
          if (uVar10 == 0 || iVar7 < gametic) {
            if (bVar4) {
              NotifyTop = NotifyTop + iVar17;
              iVar8 = iVar8 + iVar17;
            }
            *(undefined4 *)((long)&NotifyStrings[0].TimeOut + lVar15) = 0;
          }
          else {
            iVar7 = *(int *)((long)&NotifyStrings[0].PrintLevel + lVar15);
            if (show_messages.Value == false) {
              if (iVar7 != 0x80) goto LAB_004a4ec5;
              dVar25 = (double)(int)uVar10 / 6.0;
              if (5 < uVar10) {
                dVar25 = 1.0;
              }
              iVar11 = 0xb;
            }
            else {
              dVar25 = (double)(int)uVar10 / 6.0;
              if (5 < uVar10) {
                dVar25 = 1.0;
              }
              iVar11 = 0xb;
              if (iVar7 < 5) {
                iVar11 = PrintColors[iVar7];
              }
            }
            if (con_scaletext.Value - 2U < 2) {
LAB_004a4b6a:
              if (bVar3 == false) {
                if (con_scaletext.Value == 3) {
                  iVar7 = 4;
                }
                else {
                  iVar7 = con_scaletext.Value;
                  if (con_scaletext.Value != 2) {
                    iVar7 = uiscale.Value;
                  }
                }
                DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar11,0,iVar8,
                                  *(char **)((long)&NotifyStrings[0].Text.Chars + lVar15),0x40001399
                                  ,(long)(screen->super_DSimpleCanvas).super_DCanvas.Width /
                                   (long)iVar7 & 0xffffffff,0x4000139a,
                                  (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                                  (long)iVar7 & 0xffffffff,0x400013a8,1,0x4000138c,0);
              }
              else {
                if (con_scaletext.Value == 3) {
                  iVar7 = 4;
                }
                else {
                  iVar7 = con_scaletext.Value;
                  if (con_scaletext.Value != 2) {
                    iVar7 = uiscale.Value;
                  }
                }
                iVar20 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                iVar24 = FFont::StringWidth(SmallFont,
                                            *(BYTE **)((long)&NotifyStrings[0].Text.Chars + lVar15))
                ;
                iVar24 = iVar20 / iVar7 - iVar24;
                if (con_scaletext.Value == 3) {
                  iVar7 = iVar24 + 3;
                  if (-1 < iVar24) {
                    iVar7 = iVar24;
                  }
                  iVar24 = iVar7 >> 2;
                  iVar7 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                  iVar20 = iVar7 + 3;
                  if (-1 < iVar7) {
                    iVar20 = iVar7;
                  }
                  uVar22 = (ulong)(uint)(iVar20 >> 2);
                  iVar7 = 4;
                }
                else if (con_scaletext.Value == 2) {
                  iVar24 = iVar24 / 2;
                  uVar22 = (ulong)(uint)((screen->super_DSimpleCanvas).super_DCanvas.Width / 2);
                  iVar7 = 2;
                }
                else if (con_scaletext.Value == 1) {
                  iVar24 = iVar24 / uiscale.Value;
                  uVar22 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Width /
                           (long)uiscale.Value & 0xffffffff;
                  iVar7 = uiscale.Value;
                }
                else {
                  uVar22 = (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width;
                  iVar7 = 1;
                }
                DCanvas::DrawText((DCanvas *)pDVar6,pFVar5,iVar11,iVar24,iVar8,
                                  *(char **)((long)&NotifyStrings[0].Text.Chars + lVar15),0x40001399
                                  ,dVar25,uVar22,0x4000139a,
                                  (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                                  (long)iVar7 & 0xffffffff,0x400013a8,1,0x4000138c,0);
              }
            }
            else if ((con_scaletext.Value == 1) && (uiscale.Value != 1)) {
              if (uiscale.Value != 0) goto LAB_004a4b6a;
              if (bVar3 == false) {
                pcVar13 = *(char **)((long)&NotifyStrings[0].Text.Chars + lVar15);
                iVar7 = 0;
              }
              else {
                iVar7 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                iVar20 = FFont::StringWidth(SmallFont,
                                            *(BYTE **)((long)&NotifyStrings[0].Text.Chars + lVar15))
                ;
                iVar7 = (iVar7 - iVar20 * CleanXfac) / 2;
                pcVar13 = *(char **)((long)&NotifyStrings[0].Text.Chars + lVar15);
              }
              DCanvas::DrawText((DCanvas *)pDVar6,pFVar5,iVar11,iVar7,iVar8,pcVar13,0x40001393,
                                dVar25,1,0x4000138c,0);
            }
            else {
              if (bVar3 == false) {
                pcVar13 = *(char **)((long)&NotifyStrings[0].Text.Chars + lVar15);
                iVar7 = 0;
              }
              else {
                iVar7 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                iVar20 = FFont::StringWidth(SmallFont,
                                            *(BYTE **)((long)&NotifyStrings[0].Text.Chars + lVar15))
                ;
                iVar7 = (iVar7 - iVar20) / 2;
                pcVar13 = *(char **)((long)&NotifyStrings[0].Text.Chars + lVar15);
              }
              DCanvas::DrawText((DCanvas *)pDVar6,pFVar5,iVar11,iVar7,iVar8,pcVar13,0x4000138c,
                                dVar25,0);
            }
            iVar8 = iVar8 + iVar17;
            bVar4 = false;
          }
        }
LAB_004a4ec5:
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x40);
      if (bVar4) {
        NotifyTop = 0;
      }
    }
  }
  else {
    if (ConBottom != 0) {
      if ((uint)conback.texnum < TexMan.Textures.Count) {
        img = TexMan.Textures.Array[conback.texnum].Texture;
      }
      else {
        img = (FTexture *)0x0;
      }
      uVar10 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
      uVar23 = 0xaf000000;
      if (conshade == '\0') {
        uVar23 = 0;
      }
      if (gamestate == GS_FULLCONSOLE) {
        dVar25 = 1.0;
      }
      else {
        dVar25 = (double)con_alpha.Value;
      }
      if (!hw2d) {
        dVar25 = 1.0;
      }
      DCanvas::DrawTexture
                ((DCanvas *)screen,img,0.0,(double)(int)(ConBottom - uVar10),0x40001389,dVar25,
                 (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,0x4000138a,
                 (ulong)uVar10,0x400013aa,uVar23,0x4000138c,0x400013a5,0,0);
      if ((conline == '\x01') && (iVar20 < (screen->super_DSimpleCanvas).super_DCanvas.Height)) {
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                  (screen,0,(ulong)(uint)iVar20,
                   (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
                   (ulong)(iVar20 + 1),0,0);
      }
      pDVar6 = screen;
      pFVar5 = ConFont;
      if (0xb < ConBottom) {
        iVar20 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
        if (iVar17 == 1) {
          pBVar12 = (BYTE *)GetVersionString();
          iVar8 = FFont::StringWidth(pFVar5,pBVar12);
          iVar24 = ConBottom - ConFont->FontHeight;
          pcVar13 = GetVersionString();
          DCanvas::DrawText((DCanvas *)pDVar6,pFVar5,8,(iVar20 - iVar8) + -8,iVar24 + -4,pcVar13,0);
        }
        else {
          pBVar12 = (BYTE *)GetVersionString();
          iVar24 = FFont::StringWidth(pFVar5,pBVar12);
          iVar19 = ConBottom / iVar17;
          iVar8 = ConFont->FontHeight;
          pcVar13 = GetVersionString();
          DCanvas::DrawText((DCanvas *)pDVar6,pFVar5,8,(iVar20 / iVar17 - iVar24) + -8,
                            (iVar19 - iVar8) + -4,pcVar13,0x40001399,
                            (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar17 &
                            0xffffffff,0x4000139a,
                            (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)iVar17
                            & 0xffffffff,0x400013a8,1,0);
        }
        pcVar13 = TickerLabel;
        if (TickerMax == 0) {
          TickerVisible = 0;
        }
        else {
          iVar8 = ConBottom / iVar17;
          iVar20 = ConFont->FontHeight;
          iVar24 = (screen->super_DSimpleCanvas).super_DCanvas.Width / iVar17;
          iVar24 = (int)((ulong)((long)iVar24 * 0x49f49f49) >> 0x20) - iVar24;
          iVar24 = ConCols / iVar17 + ((iVar24 >> 6) - (iVar24 >> 0x1f)) + -6;
          if (TickerLabel == (char *)0x0) {
            iVar19 = 0;
          }
          else {
            sVar14 = strlen(TickerLabel);
            iVar19 = (int)sVar14 + 2;
            mysnprintf(tickstr,0x100,"%s: ",pcVar13);
          }
          iVar9 = (*ConFont->_vptr_FFont[3])(ConFont,0x12);
          if (0x100 - iVar9 < iVar24) {
            iVar24 = (*ConFont->_vptr_FFont[3])(ConFont,0x12);
            iVar24 = 0x100 - iVar24;
          }
          tickstr[iVar19] = '\x10';
          memset(tickstr + (long)iVar19 + 1,0x11,(long)(iVar24 - iVar19));
          lVar15 = (long)iVar24;
          (tickstr + lVar15 + 1)[0] = '\x12';
          (tickstr + lVar15 + 1)[1] = ' ';
          if (TickerPercent == true) {
            mysnprintf(tickstr + lVar15 + 3,0xfd - lVar15,"%d%%",
                       ((long)(int)TickerAt * 100) / (long)(int)TickerMax & 0xffffffff);
          }
          else {
            tickstr[lVar15 + 3] = '\0';
          }
          iVar20 = (iVar8 - iVar20) + -4;
          if (iVar17 == 1) {
            DCanvas::DrawText((DCanvas *)screen,ConFont,4,8,iVar20,tickstr,0);
          }
          else {
            DCanvas::DrawText((DCanvas *)screen,ConFont,4,8,iVar20,tickstr,0x40001399,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar17
                              & 0xffffffff,0x4000139a,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                              (long)iVar17 & 0xffffffff,0x400013a8,1,0);
          }
          iVar8 = (int)(((long)((iVar24 - iVar19) * 8) * (long)(int)TickerAt) / (long)(int)TickerMax
                       ) + iVar19 * 8 + 0xd;
          if (iVar17 == 1) {
            DCanvas::DrawChar((DCanvas *)screen,ConFont,8,iVar8,iVar20,'\x13',0);
          }
          else {
            DCanvas::DrawChar((DCanvas *)screen,ConFont,8,iVar8,iVar20,'\x13',0x40001399,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar17
                              & 0xffffffff,0x4000139a,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                              (long)iVar17 & 0xffffffff,0x400013a8,1,0);
          }
          TickerVisible = 1;
        }
      }
      if (StatusBar != (DBaseStatusBar *)0x0 && !hw2d) {
        ppVar16 = StatusBar->CPlayer;
        pAVar1 = (ppVar16->camera).field_0.p;
        if (pAVar1 != (AActor *)0x0) {
          if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            if (pAVar1->player != (player_t *)0x0) {
              ppVar16 = pAVar1->player;
            }
          }
          else {
            (ppVar16->camera).field_0.p = (AActor *)0x0;
          }
        }
        if (((ppVar16->BlendA != 0.0) || (NAN(ppVar16->BlendA))) &&
           ((gamestate == GS_TITLELEVEL || (gamestate == GS_LEVEL)))) {
          (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                    (screen,(ulong)((int)(ppVar16->BlendB * 255.0) & 0xffU |
                                   ((int)(ppVar16->BlendG * 255.0) & 0xffU) << 8 |
                                   ((int)(ppVar16->BlendR * 255.0) & 0xffU) << 0x10),0,
                     (ulong)(uint)ConBottom,
                     (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
                     (ulong)(uint)((screen->super_DSimpleCanvas).super_DCanvas.Height - ConBottom));
          ST_SetNeedRefresh();
          V_SetBorderNeedRefresh();
        }
      }
    }
    if ((menuactive == MENU_Off) && (0 < iVar11)) {
      FConsoleBuffer::FormatText(conbuffer,ConFont,ConWidth / iVar17);
      ppFVar2 = (conbuffer->mBrokenLines).Array;
      iVar8 = ConBottom / iVar17;
      iVar20 = ConFont->FontHeight;
      ConsoleDrawing = 1;
      if (ppFVar2 <= ppFVar2 + (ulong)(uint)conbuffer->mTextLines + (-1 - (long)RowAdjust)) {
        ppFVar21 = ppFVar2 + (((ulong)(uint)conbuffer->mTextLines - 2) - (long)RowAdjust);
        do {
          iVar24 = ConFont->FontHeight * iVar11 - iVar7;
          pcVar13 = (ppFVar21[1]->Text).Chars;
          if (iVar17 == 1) {
            DCanvas::DrawText((DCanvas *)screen,ConFont,1,8,iVar24,pcVar13,0);
          }
          else {
            DCanvas::DrawText((DCanvas *)screen,ConFont,1,8,iVar24,pcVar13,0x40001399,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar17
                              & 0xffffffff,0x4000139a,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                              (long)iVar17 & 0xffffffff,0x400013a8,1,0);
          }
          if (ppFVar21 < ppFVar2) break;
          ppFVar21 = ppFVar21 + -1;
          bVar3 = 1 < iVar11;
          iVar11 = iVar11 + -1;
        } while (bVar3);
      }
      ConsoleDrawing = 0;
      if (0x13 < ConBottom) {
        iVar7 = iVar8 + iVar20 * -2 + -4;
        if (gamestate != GS_STARTUP) {
          CmdLine[(ulong)CmdLine[0] + 2] = '\0';
          FString::FString((FString *)tickstr,(char *)(CmdLine + (ulong)CmdLine[0x103] + 2));
          uVar18 = (uint)CmdLine[1];
          uVar10 = (uint)CmdLine[0x103];
          if (iVar17 == 1) {
            DCanvas::DrawChar((DCanvas *)screen,ConFont,8,8,iVar7,'\x1c',0);
            pDVar6 = screen;
            pFVar5 = ConFont;
            iVar11 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
            DCanvas::DrawText((DCanvas *)pDVar6,pFVar5,8,iVar11 + 8,iVar7,(char *)tickstr._0_8_,0);
            pDVar6 = screen;
            pFVar5 = ConFont;
            if (cursoron == true) {
              iVar11 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
              iVar20 = (*ConFont->_vptr_FFont[3])(ConFont,0xb);
              DCanvas::DrawChar((DCanvas *)pDVar6,pFVar5,10,iVar11 + iVar20 * (uVar18 - uVar10) + 8,
                                iVar7,'\v',0);
            }
          }
          else {
            DCanvas::DrawChar((DCanvas *)screen,ConFont,8,8,iVar7,'\x1c',0x40001399,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar17
                              & 0xffffffff,0x4000139a,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                              (long)iVar17 & 0xffffffff,0x400013a8,1,0);
            pDVar6 = screen;
            pFVar5 = ConFont;
            iVar11 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
            DCanvas::DrawText((DCanvas *)pDVar6,pFVar5,8,iVar11 + 8,iVar7,(char *)tickstr._0_8_,
                              0x40001399,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar17
                              & 0xffffffff,0x4000139a,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                              (long)iVar17 & 0xffffffff,0x400013a8,1,0);
            pDVar6 = screen;
            pFVar5 = ConFont;
            if (cursoron == true) {
              iVar11 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
              iVar20 = (*ConFont->_vptr_FFont[3])(ConFont,0xb);
              DCanvas::DrawChar((DCanvas *)pDVar6,pFVar5,10,iVar11 + iVar20 * (uVar18 - uVar10) + 8,
                                iVar7,'\v',0x40001399,
                                (long)(screen->super_DSimpleCanvas).super_DCanvas.Width /
                                (long)iVar17 & 0xffffffff,0x4000139a,
                                (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                                (long)iVar17 & 0xffffffff,0x400013a8,1,0);
            }
          }
          FString::~FString((FString *)tickstr);
        }
        if ((RowAdjust != 0) && ((ConFont->FontHeight * 7) / 2 <= ConBottom)) {
          character = (RowAdjust == conbuffer->mTextLines) * '\x02' + '\n';
          if (iVar17 == 1) {
            DCanvas::DrawChar((DCanvas *)screen,ConFont,3,0,iVar7,character,0);
          }
          else {
            DCanvas::DrawChar((DCanvas *)screen,ConFont,3,0,iVar7,character,0x40001399,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar17
                              & 0xffffffff,0x4000139a,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                              (long)iVar17 & 0xffffffff,0x400013a8,1,0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void C_DrawConsole (bool hw2d)
{
	static int oldbottom = 0;
	int lines, left, offset;

	int textScale = active_con_scale();
	if (textScale == 0)
		textScale = CleanXfac;

	left = LEFTMARGIN;
	lines = (ConBottom/textScale-ConFont->GetHeight()*2)/ConFont->GetHeight();
	if (-ConFont->GetHeight() + lines*ConFont->GetHeight() > ConBottom/textScale - ConFont->GetHeight()*7/2)
	{
		offset = -ConFont->GetHeight()/2;
		lines--;
	}
	else
	{
		offset = -ConFont->GetHeight();
	}

	if ((ConBottom < oldbottom) &&
		(gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL) &&
		(viewwindowx || viewwindowy) &&
		viewactive)
	{
		V_SetBorderNeedRefresh();
	}

	oldbottom = ConBottom;

	if (ConsoleState == c_up)
	{
		C_DrawNotifyText ();
		return;
	}
	else if (ConBottom)
	{
		int visheight;
		FTexture *conpic = TexMan[conback];

		visheight = ConBottom;

		screen->DrawTexture (conpic, 0, visheight - screen->GetHeight(),
			DTA_DestWidth, screen->GetWidth(),
			DTA_DestHeight, screen->GetHeight(),
			DTA_ColorOverlay, conshade,
			DTA_AlphaF, (hw2d && gamestate != GS_FULLCONSOLE) ? (double)con_alpha : 1.,
			DTA_Masked, false,
			TAG_DONE);
		if (conline && visheight < screen->GetHeight())
		{
			screen->Clear (0, visheight, screen->GetWidth(), visheight+1, 0, 0);
		}

		if (ConBottom >= 12)
		{
			if (textScale == 1)
				screen->DrawText (ConFont, CR_ORANGE, SCREENWIDTH - 8 -
					ConFont->StringWidth (GetVersionString()),
					ConBottom / textScale - ConFont->GetHeight() - 4,
					GetVersionString(), TAG_DONE);
			else
				screen->DrawText(ConFont, CR_ORANGE, SCREENWIDTH / textScale - 8 -
					ConFont->StringWidth(GetVersionString()),
					ConBottom / textScale - ConFont->GetHeight() - 4,
					GetVersionString(),
					DTA_VirtualWidth, screen->GetWidth() / textScale,
					DTA_VirtualHeight, screen->GetHeight() / textScale,
					DTA_KeepRatio, true, TAG_DONE);

			if (TickerMax)
			{
				char tickstr[256];
				const int tickerY = ConBottom / textScale - ConFont->GetHeight() - 4;
				size_t i;
				int tickend = ConCols / textScale - SCREENWIDTH / textScale / 90 - 6;
				int tickbegin = 0;

				if (TickerLabel)
				{
					tickbegin = (int)strlen (TickerLabel) + 2;
					mysnprintf (tickstr, countof(tickstr), "%s: ", TickerLabel);
				}
				if (tickend > 256 - ConFont->GetCharWidth(0x12))
					tickend = 256 - ConFont->GetCharWidth(0x12);
				tickstr[tickbegin] = 0x10;
				memset (tickstr + tickbegin + 1, 0x11, tickend - tickbegin);
				tickstr[tickend + 1] = 0x12;
				tickstr[tickend + 2] = ' ';
				if (TickerPercent)
				{
					mysnprintf (tickstr + tickend + 3, countof(tickstr) - tickend - 3,
						"%d%%", Scale (TickerAt, 100, TickerMax));
				}
				else
				{
					tickstr[tickend+3] = 0;
				}
				if (textScale == 1)
					screen->DrawText (ConFont, CR_BROWN, LEFTMARGIN, tickerY, tickstr, TAG_DONE);
				else
					screen->DrawText (ConFont, CR_BROWN, LEFTMARGIN, tickerY, tickstr,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

				// Draw the marker
				i = LEFTMARGIN+5+tickbegin*8 + Scale (TickerAt, (SDWORD)(tickend - tickbegin)*8, TickerMax);
				if (textScale == 1)
					screen->DrawChar (ConFont, CR_ORANGE, (int)i, tickerY, 0x13, TAG_DONE);
				else
					screen->DrawChar(ConFont, CR_ORANGE, (int)i, tickerY, 0x13,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

				TickerVisible = true;
			}
			else
			{
				TickerVisible = false;
			}
		}

		// Apply palette blend effects
		if (StatusBar != NULL && !hw2d)
		{
			player_t *player = StatusBar->CPlayer;
			if (player->camera != NULL && player->camera->player != NULL)
			{
				player = player->camera->player;
			}
			if (player->BlendA != 0 && (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL))
			{
				screen->Dim (PalEntry ((unsigned char)(player->BlendR*255), (unsigned char)(player->BlendG*255), (unsigned char)(player->BlendB*255)),
					player->BlendA, 0, ConBottom, screen->GetWidth(), screen->GetHeight() - ConBottom);
				ST_SetNeedRefresh();
				V_SetBorderNeedRefresh();
			}
		}
	}

	if (menuactive != MENU_Off)
	{
		return;
	}

	if (lines > 0)
	{
		// No more enqueuing because adding new text to the console won't touch the actual print data.
		conbuffer->FormatText(ConFont, ConWidth / textScale);
		unsigned int consolelines = conbuffer->GetFormattedLineCount();
		FBrokenLines **blines = conbuffer->GetLines();
		FBrokenLines **printline = blines + consolelines - 1 - RowAdjust;

		int bottomline = ConBottom / textScale - ConFont->GetHeight()*2 - 4;

		ConsoleDrawing = true;

		for(FBrokenLines **p = printline; p >= blines && lines > 0; p--, lines--)
		{
			if (textScale == 1)
			{
				screen->DrawText(ConFont, CR_TAN, LEFTMARGIN, offset + lines * ConFont->GetHeight(), (*p)->Text, TAG_DONE);
			}
			else
			{
				screen->DrawText(ConFont, CR_TAN, LEFTMARGIN, offset + lines * ConFont->GetHeight(), (*p)->Text,
					DTA_VirtualWidth, screen->GetWidth() / textScale,
					DTA_VirtualHeight, screen->GetHeight() / textScale,
					DTA_KeepRatio, true, TAG_DONE);
			}
		}

		ConsoleDrawing = false;

		if (ConBottom >= 20)
		{
			if (gamestate != GS_STARTUP)
			{
				// Make a copy of the command line, in case an input event is handled
				// while we draw the console and it changes.
				CmdLine[2+CmdLine[0]] = 0;
				FString command((char *)&CmdLine[2+CmdLine[259]]);
				int cursorpos = CmdLine[1] - CmdLine[259];

				if (textScale == 1)
				{
					screen->DrawChar(ConFont, CR_ORANGE, left, bottomline, '\x1c', TAG_DONE);
					screen->DrawText(ConFont, CR_ORANGE, left + ConFont->GetCharWidth(0x1c), bottomline,
						command, TAG_DONE);

					if (cursoron)
					{
						screen->DrawChar(ConFont, CR_YELLOW, left + ConFont->GetCharWidth(0x1c) + cursorpos * ConFont->GetCharWidth(0xb),
							bottomline, '\xb', TAG_DONE);
					}
				}
				else
				{
					screen->DrawChar(ConFont, CR_ORANGE, left, bottomline, '\x1c',
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

					screen->DrawText(ConFont, CR_ORANGE, left + ConFont->GetCharWidth(0x1c), bottomline,
						command,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

					if (cursoron)
					{
						screen->DrawChar(ConFont, CR_YELLOW, left + ConFont->GetCharWidth(0x1c) + cursorpos * ConFont->GetCharWidth(0xb),
							bottomline, '\xb',
							DTA_VirtualWidth, screen->GetWidth() / textScale,
							DTA_VirtualHeight, screen->GetHeight() / textScale,
							DTA_KeepRatio, true, TAG_DONE);
					}
				}
			}
			if (RowAdjust && ConBottom >= ConFont->GetHeight()*7/2)
			{
				// Indicate that the view has been scrolled up (10)
				// and if we can scroll no further (12)
				if (textScale == 1)
					screen->DrawChar (ConFont, CR_GREEN, 0, bottomline, RowAdjust == conbuffer->GetFormattedLineCount() ? 12 : 10, TAG_DONE);
				else
					screen->DrawChar(ConFont, CR_GREEN, 0, bottomline, RowAdjust == conbuffer->GetFormattedLineCount() ? 12 : 10,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);
			}
		}
	}
}